

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O1

altsvc * altsvc_createid(char *srchost,char *dsthost,size_t dlen,alpnid srcalpnid,alpnid dstalpnid,
                        uint srcport,uint dstport)

{
  unsigned_short uVar1;
  altsvc *paVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  
  paVar2 = (altsvc *)(*Curl_ccalloc)(1,0x50);
  if (paVar2 != (altsvc *)0x0) {
    sVar3 = strlen(srchost);
    if (dlen == 0 || sVar3 == 0) {
      (*Curl_cfree)(paVar2);
    }
    else {
      if ((sVar3 < 3) || (*srchost != '[')) {
        lVar5 = -(ulong)(srchost[sVar3 - 1] == '.');
      }
      else {
        srchost = srchost + 1;
        lVar5 = -2;
      }
      if ((2 < dlen) && (*dsthost == '[')) {
        dsthost = dsthost + 1;
        dlen = dlen - 2;
      }
      pcVar4 = (char *)Curl_memdup0(srchost,sVar3 + lVar5);
      (paVar2->src).host = pcVar4;
      if (pcVar4 != (char *)0x0) {
        pcVar4 = (char *)Curl_memdup0(dsthost,dlen);
        (paVar2->dst).host = pcVar4;
        if (pcVar4 != (char *)0x0) {
          (paVar2->src).alpnid = srcalpnid;
          (paVar2->dst).alpnid = dstalpnid;
          uVar1 = curlx_ultous((ulong)srcport);
          (paVar2->src).port = uVar1;
          uVar1 = curlx_ultous((ulong)dstport);
          (paVar2->dst).port = uVar1;
          return paVar2;
        }
      }
      (*Curl_cfree)((paVar2->src).host);
      (*Curl_cfree)((paVar2->dst).host);
      (*Curl_cfree)(paVar2);
    }
  }
  return (altsvc *)0x0;
}

Assistant:

static struct altsvc *altsvc_createid(const char *srchost,
                                      const char *dsthost,
                                      size_t dlen, /* dsthost length */
                                      enum alpnid srcalpnid,
                                      enum alpnid dstalpnid,
                                      unsigned int srcport,
                                      unsigned int dstport)
{
  struct altsvc *as = calloc(1, sizeof(struct altsvc));
  size_t hlen;
  if(!as)
    return NULL;
  hlen = strlen(srchost);
  DEBUGASSERT(hlen);
  DEBUGASSERT(dlen);
  if(!hlen || !dlen) {
    /* bad input */
    free(as);
    return NULL;
  }
  if((hlen > 2) && srchost[0] == '[') {
    /* IPv6 address, strip off brackets */
    srchost++;
    hlen -= 2;
  }
  else if(srchost[hlen - 1] == '.')
    /* strip off trailing dot */
    hlen--;
  if((dlen > 2) && dsthost[0] == '[') {
    /* IPv6 address, strip off brackets */
    dsthost++;
    dlen -= 2;
  }

  as->src.host = Curl_memdup0(srchost, hlen);
  if(!as->src.host)
    goto error;

  as->dst.host = Curl_memdup0(dsthost, dlen);
  if(!as->dst.host)
    goto error;

  as->src.alpnid = srcalpnid;
  as->dst.alpnid = dstalpnid;
  as->src.port = curlx_ultous(srcport);
  as->dst.port = curlx_ultous(dstport);

  return as;
error:
  altsvc_free(as);
  return NULL;
}